

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O3

RTPTransmissionInfo * __thiscall
jrtplib::RTPExternalTransmitter::GetTransmissionInfo(RTPExternalTransmitter *this)

{
  RTPMemoryManager *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  RTPTransmissionInfo *pRVar3;
  
  if (this->init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      pRVar3 = (RTPTransmissionInfo *)operator_new(0x18);
    }
    else {
      iVar2 = (*pRVar1->_vptr_RTPMemoryManager[2])(pRVar1,0x18,0x1c);
      pRVar3 = (RTPTransmissionInfo *)CONCAT44(extraout_var,iVar2);
    }
    pRVar3->protocol = ExternalProto;
    pRVar3->_vptr_RTPTransmissionInfo = (_func_int **)&PTR__RTPTransmissionInfo_0013c630;
    pRVar3[1]._vptr_RTPTransmissionInfo = (_func_int **)&this->packetinjector;
    return pRVar3;
  }
  return (RTPTransmissionInfo *)0x0;
}

Assistant:

RTPTransmissionInfo *RTPExternalTransmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPExternalTransmissionInfo(&packetinjector);
	MAINMUTEX_UNLOCK
	return tinf;
}